

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O1

string * __thiscall
embree::ParseLocation::str_abi_cxx11_(string *__return_storage_ptr__,ParseLocation *this)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  long *plVar4;
  long *plVar5;
  ulong uVar6;
  uint uVar7;
  string __str;
  long *local_78;
  long local_68;
  long lStack_60;
  char *local_58 [2];
  char local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"unknown","");
  if ((this->fileName).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  uVar1 = this->lineNumber;
  if (-1 < (long)uVar1) {
    uVar7 = 1;
    if (9 < uVar1) {
      uVar6 = uVar1;
      uVar3 = 4;
      do {
        uVar7 = uVar3;
        if (uVar6 < 100) {
          uVar7 = uVar7 - 2;
          goto LAB_0018bea0;
        }
        if (uVar6 < 1000) {
          uVar7 = uVar7 - 1;
          goto LAB_0018bea0;
        }
        if (uVar6 < 10000) goto LAB_0018bea0;
        bVar2 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        uVar3 = uVar7 + 4;
      } while (bVar2);
      uVar7 = uVar7 + 1;
    }
LAB_0018bea0:
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar7);
    std::__detail::__to_chars_10_impl<unsigned_long_long>(local_58[0],uVar7,uVar1);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x2515e5);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_68 = *plVar5;
      lStack_60 = plVar4[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar5;
      local_78 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
  }
  if ((-1 < this->lineNumber) && (uVar1 = this->colNumber, -1 < (long)uVar1)) {
    uVar7 = 1;
    if (9 < uVar1) {
      uVar6 = uVar1;
      uVar3 = 4;
      do {
        uVar7 = uVar3;
        if (uVar6 < 100) {
          uVar7 = uVar7 - 2;
          goto LAB_0018bfcb;
        }
        if (uVar6 < 1000) {
          uVar7 = uVar7 - 1;
          goto LAB_0018bfcb;
        }
        if (uVar6 < 10000) goto LAB_0018bfcb;
        bVar2 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        uVar3 = uVar7 + 4;
      } while (bVar2);
      uVar7 = uVar7 + 1;
    }
LAB_0018bfcb:
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar7);
    std::__detail::__to_chars_10_impl<unsigned_long_long>(local_58[0],uVar7,uVar1);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x255a49);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_68 = *plVar5;
      lStack_60 = plVar4[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar5;
      local_78 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
    {
      std::string str = "unknown";
      if (fileName) str = *fileName;
      if (lineNumber >= 0) str += " line " + toString(lineNumber);
      if (lineNumber >= 0 && colNumber >= 0) str += " character " + toString(colNumber);
      return str;
    }